

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

void gcm_mult(mbedtls_gcm_context *ctx,uchar *x,uchar *output)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong local_18 [2];
  
  if (ctx->acceleration != '\0') {
    return;
  }
  bVar1 = x[0xf];
  uVar2 = (ulong)((bVar1 & 0xf) << 4);
  uVar5 = *(ulong *)((long)ctx->H[0] + uVar2);
  uVar2 = *(ulong *)((long)ctx->H[0] + uVar2 + 8);
  local_18[1] = uVar2 >> 4 | uVar5 << 0x3c;
  local_18[0] = (ulong)last4[(uint)uVar2 & 0xf] << 0x30 ^ uVar5 >> 4;
  for (uVar5 = 0; uVar5 < 9; uVar5 = uVar5 + 8) {
    *(ulong *)((long)local_18 + uVar5) =
         *(ulong *)((long)local_18 + uVar5) ^
         *(ulong *)((long)ctx->H[0] + uVar5 + (bVar1 & 0xfffffff0));
  }
  for (uVar4 = 0xe; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    bVar1 = x[uVar4];
    uVar3 = (uint)local_18[1];
    local_18[1] = local_18[1] >> 4 | local_18[0] << 0x3c;
    local_18[0] = (ulong)last4[uVar3 & 0xf] << 0x30 ^ local_18[0] >> 4;
    for (uVar5 = 0; uVar5 < 9; uVar5 = uVar5 + 8) {
      *(ulong *)((long)local_18 + uVar5) =
           *(ulong *)((long)local_18 + uVar5) ^
           *(ulong *)((long)ctx->H[0] + uVar5 + ((bVar1 & 0xf) << 4));
    }
    uVar3 = (uint)local_18[1];
    local_18[1] = local_18[1] >> 4 | local_18[0] << 0x3c;
    local_18[0] = (ulong)last4[uVar3 & 0xf] << 0x30 ^ local_18[0] >> 4;
    for (uVar5 = 0; uVar5 < 9; uVar5 = uVar5 + 8) {
      *(ulong *)((long)local_18 + uVar5) =
           *(ulong *)((long)local_18 + uVar5) ^
           *(ulong *)((long)ctx->H[0] + uVar5 + (bVar1 & 0xfffffff0));
    }
  }
  *(ulong *)output =
       local_18[0] >> 0x38 | (local_18[0] & 0xff000000000000) >> 0x28 |
       (local_18[0] & 0xff0000000000) >> 0x18 | (local_18[0] & 0xff00000000) >> 8 |
       (local_18[0] & 0xff000000) << 8 | (local_18[0] & 0xff0000) << 0x18 |
       (local_18[0] & 0xff00) << 0x28 | local_18[0] << 0x38;
  *(ulong *)(output + 8) =
       local_18[1] >> 0x38 | (local_18[1] & 0xff000000000000) >> 0x28 |
       (local_18[1] & 0xff0000000000) >> 0x18 | (local_18[1] & 0xff00000000) >> 8 |
       (local_18[1] & 0xff000000) << 8 | (local_18[1] & 0xff0000) << 0x18 |
       (local_18[1] & 0xff00) << 0x28 | local_18[1] << 0x38;
  return;
}

Assistant:

static void gcm_mult(mbedtls_gcm_context *ctx, const unsigned char x[16],
                     unsigned char output[16])
{
    switch (ctx->acceleration) {
#if defined(MBEDTLS_AESNI_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESNI:
            mbedtls_aesni_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESCE:
            mbedtls_aesce_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_GCM_LARGE_TABLE)
        case MBEDTLS_GCM_ACC_LARGETABLE:
            gcm_mult_largetable(output, x, ctx->H);
            break;
#else
        case MBEDTLS_GCM_ACC_SMALLTABLE:
            gcm_mult_smalltable(output, x, ctx->H);
            break;
#endif
    }

    return;
}